

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O2

Boxed_Value
chaiscript::detail::const_var_impl<chaiscript::dispatch::Proxy_Function_Base>
          (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *t)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_20;
  
  std::
  const_pointer_cast<chaiscript::dispatch::Proxy_Function_Base_const,chaiscript::dispatch::Proxy_Function_Base>
            (&local_20);
  Boxed_Value::Object_Data::get<chaiscript::dispatch::Proxy_Function_Base_const>
            ((Object_Data *)t,
             (shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)&local_20,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)t;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value const_var_impl(const std::shared_ptr<T> &t) {
      return Boxed_Value(std::const_pointer_cast<typename std::add_const<T>::type>(t));
    }